

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

void cmd_cancel_repeat(void)

{
  int iVar1;
  command *cmd;
  
  iVar1 = (cmd_tail + L'\x13') % 0x14;
  if ((cmd_queue[iVar1].nrepeats != 0) || (repeating)) {
    cmd_queue[iVar1].nrepeats = 0;
    repeating = false;
    player->upkeep->redraw = player->upkeep->redraw | 0x8000;
  }
  return;
}

Assistant:

void cmd_cancel_repeat(void)
{
	struct command *cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];

	if (cmd->nrepeats || repeating) {
		/* Cancel */
		cmd->nrepeats = 0;
		repeating = false;

		/* Redraw the state (later) */
		player->upkeep->redraw |= (PR_STATE);
	}
}